

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

uchar * archive_entry_digest(archive_entry *entry,wchar_t type)

{
  switch(type) {
  case L'\x01':
    return (entry->digest).md5;
  case L'\x02':
    return (entry->digest).rmd160;
  case L'\x03':
    return (entry->digest).sha1;
  case L'\x04':
    return (entry->digest).sha256;
  case L'\x05':
    return (entry->digest).sha384;
  case L'\x06':
    return (entry->digest).sha512;
  default:
    return (uchar *)0x0;
  }
}

Assistant:

const unsigned char *
archive_entry_digest(struct archive_entry *entry, int type)
{
	switch (type) {
	case ARCHIVE_ENTRY_DIGEST_MD5:
		return entry->digest.md5;
	case ARCHIVE_ENTRY_DIGEST_RMD160:
		return entry->digest.rmd160;
	case ARCHIVE_ENTRY_DIGEST_SHA1:
		return entry->digest.sha1;
	case ARCHIVE_ENTRY_DIGEST_SHA256:
		return entry->digest.sha256;
	case ARCHIVE_ENTRY_DIGEST_SHA384:
		return entry->digest.sha384;
	case ARCHIVE_ENTRY_DIGEST_SHA512:
		return entry->digest.sha512;
	default:
		return NULL;
	}
}